

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::DestinationEncoder::operator()[abi_cxx11_
          (DestinationEncoder *this,WitnessUnknown *id)

{
  uint uVar1;
  size_type sVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  data *in_RDX;
  string *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *program;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  CChainParams *in_stack_ffffffffffffff48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  string *this_01;
  allocator_type *in_stack_ffffffffffffff80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff88;
  undefined1 *puVar5;
  initializer_list<unsigned_char> in_stack_ffffffffffffff90;
  string *psVar6;
  Encoding encoding;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_29;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  psVar6 = in_RDI;
  WitnessUnknown::GetWitnessProgram((WitnessUnknown *)in_stack_ffffffffffffff48);
  encoding = (Encoding)((ulong)psVar6 >> 0x20);
  uVar1 = WitnessUnknown::GetWitnessVersion((WitnessUnknown *)in_stack_ffffffffffffff48);
  if (uVar1 != 0) {
    uVar1 = WitnessUnknown::GetWitnessVersion((WitnessUnknown *)in_stack_ffffffffffffff48);
    if (uVar1 < 0x11) {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_ffffffffffffff48);
      if (1 < sVar2) {
        sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_ffffffffffffff48);
        if (sVar2 < 0x29) {
          uVar1 = WitnessUnknown::GetWitnessVersion((WitnessUnknown *)in_stack_ffffffffffffff48);
          local_9 = (undefined1)uVar1;
          this_00 = &local_29;
          std::allocator<unsigned_char>::allocator
                    ((allocator<unsigned_char> *)in_stack_ffffffffffffff48);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,in_stack_ffffffffffffff80);
          std::allocator<unsigned_char>::~allocator
                    ((allocator<unsigned_char> *)in_stack_ffffffffffffff48);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_ffffffffffffff48);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                    (in_stack_ffffffffffffff88,(size_type)in_stack_ffffffffffffff80);
          puVar5 = (undefined1 *)
                   ((long)&local_29.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + 1);
          cVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_00);
          cVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_00);
          ConvertBits<8,5,true,(anonymous_namespace)::DestinationEncoder::operator()[abi:cxx11](WitnessUnknown_const&)const::_lambda(unsigned_char)_1_,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,(anonymous_namespace)::IntIdentity>
                    (puVar5,cVar3._M_current,cVar4._M_current);
          CChainParams::Bech32HRP_abi_cxx11_(in_stack_ffffffffffffff48);
          bech32::Encode(encoding,in_RSI,in_RDX);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
          goto LAB_01974794;
        }
      }
    }
  }
  std::__cxx11::string::string(this_01);
LAB_01974794:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

std::string operator()(const WitnessUnknown& id) const
    {
        const std::vector<unsigned char>& program = id.GetWitnessProgram();
        if (id.GetWitnessVersion() < 1 || id.GetWitnessVersion() > 16 || program.size() < 2 || program.size() > 40) {
            return {};
        }
        std::vector<unsigned char> data = {(unsigned char)id.GetWitnessVersion()};
        data.reserve(1 + (program.size() * 8 + 4) / 5);
        ConvertBits<8, 5, true>([&](unsigned char c) { data.push_back(c); }, program.begin(), program.end());
        return bech32::Encode(bech32::Encoding::BECH32M, m_params.Bech32HRP(), data);
    }